

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall
FlowGraph::BuildLoop(FlowGraph *this,BasicBlock *headBlock,BasicBlock *tailBlock,Loop *parentLoop)

{
  Func **ppFVar1;
  IRKind IVar2;
  ScriptContext *scriptContext;
  Instr *pIVar3;
  code *pcVar4;
  bool bVar5;
  ImplicitCallFlags newFlags;
  undefined4 *puVar6;
  Loop *this_00;
  BasicBlock *pBVar7;
  LabelInstr *pLVar8;
  JITTimeFunctionBody *pJVar9;
  JITTimeProfileInfo *pJVar10;
  undefined1 local_b8 [8];
  NoRecoverMemoryJitArenaAllocator tempAlloc;
  
  if (this->func->m_isBackgroundJIT == false) {
    scriptContext = (ScriptContext *)this->func->m_scriptContextInfo;
    ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  }
  if (tailBlock->number < headBlock->number) {
    *(ushort *)&headBlock->field_0x18 = *(ushort *)&headBlock->field_0x18 & 0xfffb;
    pIVar3 = headBlock->firstInstr;
    IVar2 = pIVar3->m_kind;
    if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar5) {
LAB_0041c21a:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    ppFVar1 = &pIVar3[1].m_func;
    *(byte *)ppFVar1 = *(byte *)ppFVar1 & 0xfe;
  }
  else {
    if ((*(ushort *)&headBlock->field_0x18 & 4) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x4ff,"(headBlock->isLoopHeader)","headBlock->isLoopHeader");
      if (!bVar5) goto LAB_0041c21a;
      *puVar6 = 0;
    }
    this_00 = (Loop *)new<Memory::JitArenaAllocator>(0x1d8,this->func->m_alloc,0x425974);
    Loop::Loop(this_00,this->func->m_alloc,this->func);
    this_00->next = this->loopList;
    this->loopList = this_00;
    headBlock->loop = this_00;
    this_00->headBlock = headBlock;
    this_00->int32SymsOnEntry = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    this_00->lossyInt32SymsOnEntry = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    if ((parentLoop != (Loop *)0x0) && (parentLoop->headBlock->number < headBlock->number)) {
      this_00->parent = parentLoop;
      parentLoop->field_0x179 = parentLoop->field_0x179 & 0xfe;
    }
    this_00->memOpInfo = (MemOpInfo *)0x0;
    *(ushort *)&this_00->field_0x178 = (ushort)*(undefined4 *)&this_00->field_0x178 & 0xfbf9 | 0x400
    ;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_b8,
               L"BE-LoopBuilder",
               (this->func->m_alloc->super_ArenaAllocator).
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               super_ArenaData.pageAllocator,Js::Throw::OutOfMemory,(_func_void *)0x0);
    tempAlloc.super_JitArenaAllocator.super_ArenaAllocator.
    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = (void *)0x0;
    WalkLoopBlocks(this,tailBlock,this_00,(JitArenaAllocator *)local_b8);
    pBVar7 = Loop::GetHeadBlock(this_00);
    if (pBVar7 != headBlock) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x517,"(loop->GetHeadBlock() == headBlock)",
                         "loop->GetHeadBlock() == headBlock");
      if (!bVar5) goto LAB_0041c21a;
      *puVar6 = 0;
    }
    pLVar8 = Loop::GetLoopTopInstr(this_00);
    if ((pLVar8->field_0x78 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x2db,"(this->m_isLoopTop)","this->m_isLoopTop");
      if (!bVar5) goto LAB_0041c21a;
      *puVar6 = 0;
    }
    pLVar8->m_loop = this_00;
    if ((pLVar8->super_Instr).m_kind == InstrKindProfiledLabel) {
      Loop::SetImplicitCallFlags(this_00,*(ImplicitCallFlags *)&pLVar8[1].super_Instr._vptr_Instr);
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      bVar5 = JITTimeFunctionBody::HasProfileInfo(pJVar9);
      if (bVar5) {
        pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pJVar10 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar9);
        bVar5 = JITTimeProfileInfo::IsLoopImplicitCallInfoDisabled(pJVar10);
        if (bVar5) {
          pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          pJVar10 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar9);
          newFlags = JITTimeProfileInfo::GetImplicitCallFlags(pJVar10);
          Loop::SetImplicitCallFlags(this_00,newFlags);
        }
      }
      if ((pLVar8->super_Instr).m_kind != InstrKindProfiledLabel) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xe3,"(this->IsProfiledLabelInstr())",
                           "Bad call to AsProfiledLabelInstr()");
        if (!bVar5) goto LAB_0041c21a;
        *puVar6 = 0;
      }
      this_00->loopFlags = *(LoopFlags *)((long)&pLVar8[1].super_Instr._vptr_Instr + 1);
    }
    else {
      Loop::SetImplicitCallFlags(this_00,ImplicitCall_All);
    }
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_b8);
  }
  return;
}

Assistant:

void
FlowGraph::BuildLoop(BasicBlock *headBlock, BasicBlock *tailBlock, Loop *parentLoop)
{
    // This function is recursive, so when jitting in the foreground, probe the stack
    if(!func->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(func->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    if (tailBlock->number < headBlock->number)
    {
        // Not a loop.  We didn't see any back-edge.
        headBlock->isLoopHeader = false;
        headBlock->GetFirstInstr()->AsLabelInstr()->m_isLoopTop = false;
        return;
    }

    Assert(headBlock->isLoopHeader);
    Loop *loop = JitAnewZ(this->GetFunc()->m_alloc, Loop, this->GetFunc()->m_alloc, this->GetFunc());
    loop->next = this->loopList;
    this->loopList = loop;
    headBlock->loop = loop;
    loop->headBlock = headBlock;
    loop->int32SymsOnEntry = nullptr;
    loop->lossyInt32SymsOnEntry = nullptr;

    // If parentLoop is a parent of loop, it's headBlock better appear first.
    if (parentLoop && loop->headBlock->number > parentLoop->headBlock->number)
    {
        loop->parent = parentLoop;
        parentLoop->isLeaf = false;
    }
    loop->hasDeadStoreCollectionPass = false;
    loop->hasDeadStorePrepass = false;
    loop->memOpInfo = nullptr;
    loop->doMemOp = true;

    NoRecoverMemoryJitArenaAllocator tempAlloc(_u("BE-LoopBuilder"), this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);

    WalkLoopBlocks(tailBlock, loop, &tempAlloc);

    Assert(loop->GetHeadBlock() == headBlock);

    IR::LabelInstr * firstInstr = loop->GetLoopTopInstr();

    firstInstr->SetLoop(loop);

    if (firstInstr->IsProfiledLabelInstr())
    {
        loop->SetImplicitCallFlags(firstInstr->AsProfiledLabelInstr()->loopImplicitCallFlags);
        if (this->func->HasProfileInfo() && this->func->GetReadOnlyProfileInfo()->IsLoopImplicitCallInfoDisabled())
        {
            loop->SetImplicitCallFlags(this->func->GetReadOnlyProfileInfo()->GetImplicitCallFlags());
        }
        loop->SetLoopFlags(firstInstr->AsProfiledLabelInstr()->loopFlags);
    }
    else
    {
        // Didn't collect profile information, don't do optimizations
        loop->SetImplicitCallFlags(Js::ImplicitCall_All);
    }
}